

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int ParseEXRMultipartHeaderFromMemory
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,uchar *memory,
              size_t size,char **err)

{
  long lVar1;
  EXRVersion *pEVar2;
  char **ppcVar3;
  pointer pHVar4;
  uchar *puVar5;
  bool bVar6;
  undefined4 in_EAX;
  int iVar7;
  char *pcVar8;
  EXRHeader **ppEVar9;
  EXRHeader *exr_header;
  pointer pTVar10;
  int iVar11;
  long lVar12;
  EXRHeader ***pppEVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  bool empty_header;
  string err_str;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> infos;
  HeaderInfo info;
  bool local_185;
  int local_184;
  EXRVersion *local_180;
  string local_178;
  EXRHeader ***local_158;
  char **local_150;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> local_148;
  uchar *local_130;
  int *local_128;
  size_t local_120;
  undefined1 local_118 [16];
  TChannelInfo local_108;
  int local_b4;
  uint local_9c;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  char *local_50 [2];
  char local_40 [16];
  
  auVar16._0_4_ = -(uint)(exr_headers == (EXRHeader ***)0x0);
  auVar16._4_4_ = -(uint)(memory == (uchar *)0x0);
  auVar16._8_4_ = -(uint)(num_headers == (int *)0x0);
  auVar16._12_4_ = -(uint)(exr_version == (EXRVersion *)0x0);
  iVar7 = movmskps(in_EAX,auVar16);
  if (iVar7 == 0) {
    if (size < 8) {
      local_118._0_8_ = &local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Data size too short","");
      if (err != (char **)0x0) {
        pcVar8 = strdup((char *)local_118._0_8_);
        *err = pcVar8;
      }
      if ((TChannelInfo *)local_118._0_8_ != &local_108) {
        operator_delete((void *)local_118._0_8_);
      }
      local_184 = -4;
    }
    else {
      local_130 = memory + 8;
      local_120 = size - 8;
      local_148.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_180 = exr_version;
      local_158 = exr_headers;
      local_150 = err;
      local_128 = num_headers;
      do {
        local_108.name.field_2._M_allocated_capacity = 0;
        local_108.name.field_2._8_8_ = 0;
        local_108.name._M_dataplus._M_p = (pointer)0x0;
        local_108.name._M_string_length = 0;
        local_118._0_8_ = (TChannelInfo *)0x0;
        local_118._8_8_ = (pointer)0x0;
        local_90._M_p = (pointer)&local_80;
        local_88 = 0;
        local_80._M_local_buf[0] = '\0';
        local_70._M_p = (pointer)&local_60;
        local_68 = 0;
        local_60._M_local_buf[0] = '\0';
        tinyexr::HeaderInfo::clear((HeaderInfo *)local_118);
        puVar5 = local_130;
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        local_178._M_string_length = 0;
        local_178.field_2._M_local_buf[0] = '\0';
        local_185 = false;
        iVar7 = tinyexr::ParseEXRHeader
                          ((HeaderInfo *)local_118,&local_185,exr_version,&local_178,local_130,
                           local_120);
        ppcVar3 = local_150;
        if (iVar7 == 0) {
          if (local_185 == true) {
            local_130 = puVar5 + 1;
            iVar11 = 2;
            exr_version = local_180;
            iVar7 = local_184;
          }
          else if (local_b4 == 0) {
            if (local_108.name.field_2._M_allocated_capacity != local_108.name._M_string_length) {
              lVar12 = 0x200;
              uVar14 = 0;
              do {
                if (*(void **)(local_108.name._M_string_length + lVar12) != (void *)0x0) {
                  free(*(void **)(local_108.name._M_string_length + lVar12));
                }
                uVar14 = uVar14 + 1;
                lVar12 = lVar12 + 0x210;
              } while (uVar14 < (ulong)(((long)(local_108.name.field_2._M_allocated_capacity -
                                               local_108.name._M_string_length) >> 4) *
                                       0xf83e0f83e0f83e1));
            }
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,"`chunkCount\' attribute is not found in the header.","");
            exr_version = local_180;
            if (ppcVar3 != (char **)0x0) {
              pcVar8 = strdup(local_50[0]);
              *ppcVar3 = pcVar8;
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
            local_184 = -4;
            iVar11 = 1;
            iVar7 = local_184;
          }
          else {
            std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::push_back
                      (&local_148,(HeaderInfo *)local_118);
            local_130 = puVar5 + local_9c;
            iVar11 = 0;
            exr_version = local_180;
            iVar7 = local_184;
          }
        }
        else {
          if (local_108.name.field_2._M_allocated_capacity != local_108.name._M_string_length) {
            lVar12 = 0x200;
            uVar14 = 0;
            do {
              if (*(void **)(local_108.name._M_string_length + lVar12) != (void *)0x0) {
                free(*(void **)(local_108.name._M_string_length + lVar12));
              }
              uVar14 = uVar14 + 1;
              lVar12 = lVar12 + 0x210;
            } while (uVar14 < (ulong)(((long)(local_108.name.field_2._M_allocated_capacity -
                                             local_108.name._M_string_length) >> 4) *
                                     0xf83e0f83e0f83e1));
          }
          ppcVar3 = local_150;
          iVar11 = 1;
          exr_version = local_180;
          if (local_150 != (char **)0x0) {
            pcVar8 = strdup(local_178._M_dataplus._M_p);
            *ppcVar3 = pcVar8;
            exr_version = local_180;
          }
        }
        local_184 = iVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_p != &local_80) {
          operator_delete(local_90._M_p);
        }
        if ((pointer)local_108.name._M_string_length != (pointer)0x0) {
          operator_delete((void *)local_108.name._M_string_length);
        }
        std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::~vector
                  ((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)
                   local_118);
      } while (iVar11 == 0);
      if (iVar11 == 2) {
        ppEVar9 = (EXRHeader **)
                  malloc(((ulong)((long)local_148.
                                        super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_148.
                                       super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                         0x7ae147ae147ae148);
        *local_158 = ppEVar9;
        if (local_148.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_148.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar14 = 0;
          local_184 = 0;
        }
        else {
          uVar15 = 0;
          local_184 = 0;
          do {
            pHVar4 = local_148.
                     super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            exr_header = (EXRHeader *)malloc(0x188);
            memset(exr_header,0,0x188);
            local_118._8_8_ = (pointer)0x0;
            local_108.name._M_dataplus._M_p = local_108.name._M_dataplus._M_p & 0xffffffffffffff00;
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            local_178._M_string_length = 0;
            local_178.field_2._M_local_buf[0] = '\0';
            local_118._0_8_ = &local_108;
            bVar6 = tinyexr::ConvertHeader
                              (exr_header,pHVar4 + uVar15,(string *)local_118,&local_178);
            pEVar2 = local_180;
            pppEVar13 = local_158;
            if (!bVar6) {
              pTVar10 = local_148.
                        super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar15].attributes.
                        super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (local_148.
                  super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar15].attributes.
                  super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
                  super__Vector_impl_data._M_finish != pTVar10) {
                lVar12 = uVar15 * 200 + 0xe8;
                do {
                  if (pTVar10->value != (uchar *)0x0) {
                    free(pTVar10->value);
                  }
                  uVar15 = uVar15 + 1;
                  pTVar10 = *(pointer *)
                             ((long)(local_148.
                                     super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                    screen_window_center + lVar12 + -0x5c);
                  lVar1 = lVar12 + -0x54;
                  lVar12 = lVar12 + 200;
                } while (*(pointer *)
                          ((long)(local_148.
                                  super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->screen_window_center +
                          lVar1) != pTVar10);
              }
              pppEVar13 = local_158;
              if (local_150 == (char **)0x0) {
                local_184 = -9;
              }
              else {
                local_184 = -9;
                if (local_178._M_string_length != 0) {
                  pcVar8 = strdup(local_178._M_dataplus._M_p);
                  *local_150 = pcVar8;
                }
              }
            }
            exr_header->multipart = (uint)(pEVar2->multipart != 0);
            (*pppEVar13)[uVar15] = exr_header;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p);
            }
            if ((TChannelInfo *)local_118._0_8_ != &local_108) {
              operator_delete((void *)local_118._0_8_);
            }
            uVar15 = uVar15 + 1;
            uVar14 = ((long)local_148.
                            super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_148.
                            super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x70a3d70a3d70a3d7;
          } while (uVar15 < uVar14);
        }
        *local_128 = (int)uVar14;
      }
      std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::~vector(&local_148);
    }
  }
  else {
    local_118._0_8_ = &local_108;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,"Invalid argument for ParseEXRMultipartHeaderFromMemory","");
    if (err != (char **)0x0) {
      pcVar8 = strdup((char *)local_118._0_8_);
      *err = pcVar8;
    }
    if ((TChannelInfo *)local_118._0_8_ != &local_108) {
      operator_delete((void *)local_118._0_8_);
    }
    local_184 = -3;
  }
  return local_184;
}

Assistant:

int ParseEXRMultipartHeaderFromMemory(EXRHeader ***exr_headers,
                                      int *num_headers,
                                      const EXRVersion *exr_version,
                                      const unsigned char *memory, size_t size,
                                      const char **err) {
  if (memory == NULL || exr_headers == NULL || num_headers == NULL ||
      exr_version == NULL) {
    // Invalid argument
    tinyexr::SetErrorMessage(
        "Invalid argument for ParseEXRMultipartHeaderFromMemory", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (size < tinyexr::kEXRVersionSize) {
    tinyexr::SetErrorMessage("Data size too short", err);
    return TINYEXR_ERROR_INVALID_DATA;
  }

  const unsigned char *marker = memory + tinyexr::kEXRVersionSize;
  size_t marker_size = size - tinyexr::kEXRVersionSize;

  std::vector<tinyexr::HeaderInfo> infos;

  for (;;) {
    tinyexr::HeaderInfo info;
    info.clear();

    std::string err_str;
    bool empty_header = false;
    int ret = ParseEXRHeader(&info, &empty_header, exr_version, &err_str,
                             marker, marker_size);

    if (ret != TINYEXR_SUCCESS) {

      // Free malloc-allocated memory here.
      for (size_t i = 0; i < info.attributes.size(); i++) {
        if (info.attributes[i].value) {
          free(info.attributes[i].value);
        }
      }

      tinyexr::SetErrorMessage(err_str, err);
      return ret;
    }

    if (empty_header) {
      marker += 1;  // skip '\0'
      break;
    }

    // `chunkCount` must exist in the header.
    if (info.chunk_count == 0) {

      // Free malloc-allocated memory here.
      for (size_t i = 0; i < info.attributes.size(); i++) {
        if (info.attributes[i].value) {
          free(info.attributes[i].value);
        }
      }

      tinyexr::SetErrorMessage(
          "`chunkCount' attribute is not found in the header.", err);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    infos.push_back(info);

    // move to next header.
    marker += info.header_len;
    size -= info.header_len;
  }

  // allocate memory for EXRHeader and create array of EXRHeader pointers.
  (*exr_headers) =
      static_cast<EXRHeader **>(malloc(sizeof(EXRHeader *) * infos.size()));

  
  int retcode = TINYEXR_SUCCESS;

  for (size_t i = 0; i < infos.size(); i++) {
    EXRHeader *exr_header = static_cast<EXRHeader *>(malloc(sizeof(EXRHeader)));
    memset(exr_header, 0, sizeof(EXRHeader));

    std::string warn;
    std::string _err;
    if (!ConvertHeader(exr_header, infos[i], &warn, &_err)) {

      // Free malloc-allocated memory here.
      for (size_t k = 0; k < infos[i].attributes.size(); i++) {
        if (infos[i].attributes[k].value) {
          free(infos[i].attributes[k].value);
        }
      }

      if (!_err.empty()) {
        tinyexr::SetErrorMessage(
            _err, err);
      }
      // continue to converting headers
      retcode = TINYEXR_ERROR_INVALID_HEADER;
    }

    exr_header->multipart = exr_version->multipart ? 1 : 0;

    (*exr_headers)[i] = exr_header;
  }

  (*num_headers) = static_cast<int>(infos.size());

  return retcode;
}